

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void print_token(vector<Token,_std::allocator<Token>_> *v)

{
  Token *pTVar1;
  ostream *poVar2;
  Token *this;
  string local_250;
  fstream f;
  ostream local_220 [512];
  
  std::fstream::fstream(&f);
  std::fstream::open((char *)&f,0x10e020);
  pTVar1 = (v->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (this = (v->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.super__Vector_impl_data
              ._M_start; this != pTVar1; this = this + 1) {
    Token::to_string_abi_cxx11_(&local_250,this);
    poVar2 = std::operator<<(local_220,(string *)&local_250);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_250);
  }
  std::fstream::close();
  std::fstream::~fstream(&f);
  return;
}

Assistant:

void print_token(const vector<Token> &v) {
    fstream f;
    f.open("token.txt", ios::out);
    for (const auto &it : v) {
        f << it.to_string() << endl;
    }
    f.close();
}